

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::AddCustomCommandToOutput
          (cmMakefile *this,unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc,
          CommandSourceCallback *callback,bool replace)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs_00;
  cmCustomCommandLines *commandLines;
  undefined8 *puVar2;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  _Any_data local_a8;
  PositionType local_98;
  cmMakefile *local_60;
  undefined1 local_58;
  function<void_(cmSourceFile_*)> local_50;
  
  outputs = cmCustomCommand::GetOutputs_abi_cxx11_
                      ((cc->_M_t).
                       super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                       .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  outputs_00 = cmCustomCommand::GetByproducts_abi_cxx11_
                         ((cc->_M_t).
                          super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                          .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  commandLines = cmCustomCommand::GetCommandLines
                           ((cc->_M_t).
                            super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                            .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  if ((outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8._M_pod_data,"Attempt to add a custom rule with no output!",
               (allocator<char> *)&local_60);
    cmSystemTools::Error((string *)&local_a8);
    std::__cxx11::string::~string((string *)local_a8._M_pod_data);
  }
  else {
    bVar1 = ValidateCustomCommand(this,commandLines);
    if (bVar1) {
      CreateGeneratedOutputs(this,outputs);
      CreateGeneratedOutputs(this,outputs_00);
      local_98 = (this->StateSnapshot).Position.Position;
      local_a8._M_unused._M_object = (this->StateSnapshot).State;
      local_a8._8_8_ = (this->StateSnapshot).Position.Tree;
      cmCustomCommand::RecordPolicyValues
                ((cc->_M_t).
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                 (cmStateSnapshot *)&local_a8);
      local_60 = this;
      local_58 = replace;
      std::function<void_(cmSourceFile_*)>::function(&local_50,callback);
      local_d0._M_head_impl =
           (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
           _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
           super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
      (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl = (cmCustomCommand *)0x0;
      local_b8 = (code *)0x0;
      pcStack_b0 = (code *)0x0;
      local_c8._M_unused._M_object = (void *)0x0;
      local_c8._8_8_ = 0;
      puVar2 = (undefined8 *)operator_new(0x30);
      *(undefined1 *)(puVar2 + 1) = local_58;
      *puVar2 = local_60;
      std::function<void_(cmSourceFile_*)>::function
                ((function<void_(cmSourceFile_*)> *)(puVar2 + 2),&local_50);
      pcStack_b0 = std::
                   _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&,_std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmMakefile.cxx:1279:5)>
                   ::_M_invoke;
      local_b8 = std::
                 _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&,_std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmMakefile.cxx:1279:5)>
                 ::_M_manager;
      local_c8._M_unused._M_object = puVar2;
      GeneratorAction::GeneratorAction
                ((GeneratorAction *)&local_a8,
                 (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_d0,
                 (CCActionT *)&local_c8);
      AddGeneratorAction(this,(GeneratorAction *)&local_a8);
      GeneratorAction::~GeneratorAction((GeneratorAction *)&local_a8);
      std::_Function_base::~_Function_base((_Function_base *)&local_c8);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_d0);
      std::_Function_base::~_Function_base(&local_50.super__Function_base);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddCustomCommandToOutput(
  std::unique_ptr<cmCustomCommand> cc, const CommandSourceCallback& callback,
  bool replace)
{
  const auto& outputs = cc->GetOutputs();
  const auto& byproducts = cc->GetByproducts();
  const auto& commandLines = cc->GetCommandLines();

  // Make sure there is at least one output.
  if (outputs.empty()) {
    cmSystemTools::Error("Attempt to add a custom rule with no output!");
    return;
  }

  // Validate custom commands.
  if (!this->ValidateCustomCommand(commandLines)) {
    return;
  }

  // Always create the output sources and mark them generated.
  this->CreateGeneratedOutputs(outputs);
  this->CreateGeneratedOutputs(byproducts);

  cc->RecordPolicyValues(this->GetStateSnapshot());

  // Dispatch command creation to allow generator expressions in outputs.
  this->AddGeneratorAction(
    std::move(cc),
    [this, replace, callback](cmLocalGenerator& lg,
                              const cmListFileBacktrace& lfbt,
                              std::unique_ptr<cmCustomCommand> tcc) {
      BacktraceGuard guard(this->Backtrace, lfbt);
      tcc->SetBacktrace(lfbt);
      cmSourceFile* sf = detail::AddCustomCommandToOutput(
        lg, cmCommandOrigin::Project, std::move(tcc), replace);
      if (callback && sf) {
        callback(sf);
      }
    });
}